

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

bool cashew::JSPrinter::ifHasElse(Ref node)

{
  bool bVar1;
  Ref *pRVar2;
  Ref local_10;
  Ref node_local;
  
  local_10.inst = node.inst;
  if ((node.inst)->type == Array) {
    pRVar2 = Ref::operator[](&local_10,0);
    bVar1 = Ref::operator==(pRVar2,(IString *)&IF);
    if (bVar1) {
      if ((local_10.inst)->type == Array) {
        if (((((local_10.inst)->field_1).arr)->
            super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements < 4) {
          bVar1 = false;
        }
        else {
          pRVar2 = Ref::operator[](&local_10,3);
          bVar1 = Ref::operator!(pRVar2);
          bVar1 = !bVar1;
        }
        return bVar1;
      }
      __assert_fail("isArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                    ,0x19a,"size_t cashew::Value::size()");
    }
  }
  __assert_fail("node->isArray() && node[0] == IF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x537,"static bool cashew::JSPrinter::ifHasElse(Ref)");
}

Assistant:

static bool ifHasElse(Ref node) {
    assert(node->isArray() && node[0] == IF);
    return node->size() >= 4 && !!node[3];
  }